

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::Handler<capnp::DynamicStruct,_(capnp::Style)2>::decodeBase
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,
          Handler<capnp::DynamicStruct,_(capnp::Style)2> *this,JsonCodec *codec,Reader input,
          Type type,Orphanage orphanage)

{
  StructSchema SVar1;
  undefined4 local_f8;
  undefined4 uStack_f0;
  undefined4 local_e8;
  undefined4 uStack_e0;
  StructDataBitCount local_d8;
  int iStack_d0;
  Orphan<capnp::DynamicStruct> local_c8;
  Builder local_a0;
  Type local_70;
  Builder local_60;
  
  local_70.field_4 = type.field_4;
  local_70._0_8_ = type._0_8_;
  SVar1 = Type::asStruct(&local_70);
  local_f8 = input._reader.segment._0_4_;
  uStack_f0 = input._reader.capTable._0_4_;
  local_e8 = input._reader.data._0_4_;
  uStack_e0 = input._reader.pointers._0_4_;
  local_d8 = input._reader.dataSize;
  iStack_d0 = input._reader.nestingLimit;
  (*(this->super_HandlerBase)._vptr_HandlerBase[5])
            (&local_c8,this,codec,SVar1.super_Schema.raw,orphanage.arena,orphanage.capTable,local_f8
             ,uStack_f0,local_e8,uStack_e0,local_d8,iStack_d0);
  Orphan<capnp::DynamicStruct>::get(&local_a0,&local_c8);
  local_60.field_1.listValue.builder.ptr = (byte *)local_a0.builder.pointers;
  local_60.field_1.listValue.builder.elementCount = local_a0.builder.dataSize;
  local_60.field_1.structValue.builder.pointerCount = local_a0.builder.pointerCount;
  local_60.field_1.listValue.builder.step._2_2_ = local_a0.builder._38_2_;
  local_60.field_1.textValue.content.size_ = (size_t)local_a0.builder.capTable;
  local_60.field_1.listValue.builder.capTable = (CapTableBuilder *)local_a0.builder.data;
  local_60.field_1.intValue = (int64_t)local_a0.schema.super_Schema.raw;
  local_60.field_1.textValue.content.ptr = (char *)local_a0.builder.segment;
  local_60.type = STRUCT;
  Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,&local_60,&local_c8.builder);
  DynamicValue::Builder::~Builder(&local_60);
  if (local_c8.builder.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_c8.builder);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> decodeBase(const JsonCodec& codec, JsonValue::Reader input,
                                  Type type, Orphanage orphanage) const override final {
    return decode(codec, input, type.asStruct(), orphanage);
  }